

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::LogParser::StartElement(LogParser *this)

{
  char **in_RDX;
  string *in_RSI;
  
  StartElement((LogParser *)&this[-1].CurChange,in_RSI,in_RDX);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) CM_OVERRIDE
  {
    this->CData.clear();
    if (name == "logentry") {
      this->Rev = Revision();
      if (const char* rev = this->FindAttribute(atts, "revision")) {
        this->Rev.Rev = rev;
      }
      this->Changes.clear();
    }
  }